

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

uint128 absl::operator%(uint128 lhs,uint128 rhs)

{
  undefined1 v [16];
  unsigned___int128 *puVar1;
  unsigned___int128 *puVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint128 *this;
  undefined8 uVar3;
  uint64_t local_38;
  uint128 rhs_local;
  uint128 lhs_local;
  
  this = (uint128 *)lhs.hi_;
  rhs_local.hi_ = lhs.lo_;
  rhs_local.lo_ = rhs.hi_;
  local_38 = rhs.lo_;
  lhs_local.lo_ = (uint64_t)this;
  puVar1 = uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)&rhs_local.hi_,this);
  uVar3 = extraout_RDX;
  puVar2 = uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)&local_38,this);
  __umodti3(puVar1,uVar3,puVar2,extraout_RDX_00);
  v._8_8_ = uVar3;
  v._0_8_ = puVar1;
  uint128::uint128((uint128 *)&lhs_local.hi_,(unsigned___int128)v);
  return stack0xffffffffffffffe8;
}

Assistant:

uint128 operator%(uint128 lhs, uint128 rhs) {
#if defined(ABSL_HAVE_INTRINSIC_INT128)
  return static_cast<unsigned __int128>(lhs) %
         static_cast<unsigned __int128>(rhs);
#else  // ABSL_HAVE_INTRINSIC_INT128
  uint128 quotient = 0;
  uint128 remainder = 0;
  DivModImpl(lhs, rhs, &quotient, &remainder);
  return remainder;
#endif  // ABSL_HAVE_INTRINSIC_INT128
}